

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_andc_i32_m68k(TCGContext_conflict2 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGOp *pTVar1;
  TCGTemp *ts;
  uintptr_t o_1;
  uintptr_t o_2;
  uintptr_t o;
  
  if (have_bmi1_m68k) {
    pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_andc_i32);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
    pTVar1->args[2] = (TCGArg)(arg2 + (long)tcg_ctx);
    return;
  }
  ts = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
  pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_not_i32);
  pTVar1->args[0] = (TCGArg)ts;
  pTVar1->args[1] = (TCGArg)(arg2 + (long)tcg_ctx);
  pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_and_i32);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)ts;
  tcg_temp_free_internal_m68k(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_andc_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (TCG_TARGET_HAS_andc_i32) {
        tcg_gen_op3_i32(tcg_ctx, INDEX_op_andc_i32, ret, arg1, arg2);
    } else {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_not_i32(tcg_ctx, t0,arg2);
        tcg_gen_and_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}